

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  __m128i *palVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  longlong lVar11;
  longlong lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  undefined8 *puVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar33;
  __m128i vH_00;
  int32_t in_stack_fffffffffffff728;
  int32_t local_8d0;
  int local_8c4;
  long local_8c0;
  int local_8b8;
  int local_8b0;
  int local_8ac;
  ulong uStack_8a8;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  uint local_71c;
  int32_t score;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int32_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_528;
  int iStack_524;
  int iStack_4f4;
  int iStack_4f0;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_118;
  int iStack_114;
  int iStack_110;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse41_128_32","profile"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse41_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar15 = (iVar1 + 3) / 4;
    iVar22 = (iVar1 + -1) % iVar15;
    uVar16 = ~((iVar1 + -1) / iVar15);
    iVar17 = uVar16 + 4;
    pvVar4 = (profile->profile32).score;
    if (-open < ppVar3->min) {
      local_8ac = open + -0x80000000;
    }
    else {
      local_8ac = -0x80000000 - ppVar3->min;
    }
    uVar18 = local_8ac + 1;
    iVar19 = 0x7ffffffe - ppVar3->max;
    lVar11 = CONCAT44(uVar18,uVar18);
    lVar12 = CONCAT44(uVar18,uVar18);
    vSaturationCheckMax[1] = CONCAT44(iVar19,iVar19);
    vSaturationCheckMin[0] = CONCAT44(iVar19,iVar19);
    vSegLenXgap[1] = (longlong)uVar18;
    result._4_4_ = -iVar15 * gap;
    iVar20 = s1_beg;
    result._0_4_ = uVar18;
    vSegLenXgap[0]._0_4_ = result._4_4_;
    vSegLenXgap[0]._4_4_ = result._4_4_;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar15 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4400402;
      uVar23 = 0;
      if (s1_beg != 0) {
        uVar23 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar23 | *(uint *)&_segNum->field_0xc;
      uVar23 = 0;
      if (s1_end != 0) {
        uVar23 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar23 | *(uint *)&_segNum->field_0xc;
      uVar23 = 0;
      if (s2_beg != 0) {
        uVar23 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar23 | *(uint *)&_segNum->field_0xc;
      uVar23 = 0;
      if (s2_end != 0) {
        uVar23 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar23 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      ptr = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar15);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.v[3] = 0;
        for (k = 0; k < iVar15; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            if (s1_beg == 0) {
              local_8b0 = -(gap * (h.v[2] * iVar15 + k)) - open;
            }
            else {
              local_8b0 = 0;
            }
            local_8b8 = local_8b0;
            if ((long)local_8b0 < -0x80000000) {
              local_8b8 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_8b8;
            local_8c0 = (long)local_8b0 - (long)open;
            if (local_8c0 < -0x80000000) {
              local_8c0 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_8c0;
          }
          ptr_02[h.v[3]][0] = e.m[1];
          ptr_02[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_8c4 = -(gap * (k + -1)) - open;
          }
          else {
            local_8c4 = 0;
          }
          local_8d0 = local_8c4;
          if (local_8c4 < -0x80000000) {
            local_8d0 = -0x80000000;
          }
          ptr_00[k] = local_8d0;
        }
        vE[1]._0_4_ = -open;
        vE[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        k = iVar15;
        while (k = k + -1, -1 < k) {
          ptr_03[k][0] = CONCAT44(vE[1]._4_4_,(int)vE[1]);
          ptr_03[k][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          vE[1]._0_4_ = (int)vE[1] - gap;
          vE[1]._4_4_ = vE[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
          local_278 = (int)vSaturationCheckMax[1];
          iStack_274 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
          iStack_270 = (int)vSaturationCheckMin[0];
          iStack_26c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
          vSaturationCheckMax[1] =
               CONCAT44((uint)(vE[1]._4_4_ < iStack_274) * vE[1]._4_4_ |
                        (uint)(vE[1]._4_4_ >= iStack_274) * iStack_274,
                        (uint)((int)vE[1] < local_278) * (int)vE[1] |
                        (uint)((int)vE[1] >= local_278) * local_278);
          vSaturationCheckMin[0] =
               CONCAT44((uint)(vGapper[0]._4_4_ < iStack_26c) * vGapper[0]._4_4_ |
                        (uint)(vGapper[0]._4_4_ >= iStack_26c) * iStack_26c,
                        (uint)((int)vGapper[0] < iStack_270) * (int)vGapper[0] |
                        (uint)((int)vGapper[0] >= iStack_270) * iStack_270);
        }
        vPosMask[1] = lVar11;
        vMaxH[0] = lVar12;
        vMaxH[1] = lVar11;
        vSaturationCheckMax[0] = lVar12;
        for (end_query = 0; end_query < s2Len; end_query = end_query + 1) {
          uVar33 = ptr_02[iVar15 + -1][0];
          iVar2 = ppVar3->mapper[(byte)s2[end_query]];
          local_328 = (int)(*ptr_03)[0];
          iStack_324 = (int)((ulong)(*ptr_03)[0] >> 0x20);
          iStack_320 = (int)(*ptr_03)[1];
          vF[1] = CONCAT44(uVar18 - iStack_324,uVar18 - local_328);
          vHt[0] = (longlong)(uVar18 - iStack_320);
          k = 0;
          pvW = (__m128i *)(uVar33 << 0x20 | (ulong)(uint)ptr_00[end_query]);
          vHp[0] = ptr_02[iVar15 + -1][1] << 0x20 | uVar33 >> 0x20;
          vH[1] = lVar11;
          vF[0] = lVar12;
          while( true ) {
            local_118 = (int)vH[1];
            iStack_114 = (int)((ulong)vH[1] >> 0x20);
            iStack_110 = (int)vF[0];
            local_4b8 = (int)vF[1];
            iStack_4b4 = (int)((ulong)vF[1] >> 0x20);
            iStack_4b0 = (int)vHt[0];
            if (iVar15 <= k) break;
            palVar5 = (__m128i *)ptr_02[k][0];
            lVar6 = ptr_02[k][1];
            lVar7 = ptr[k][0];
            lVar8 = ptr[k][1];
            puVar21 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar15) * 0x10);
            uVar9 = *puVar21;
            uVar10 = puVar21[1];
            local_338 = (int)lVar7;
            iStack_334 = (int)((ulong)lVar7 >> 0x20);
            iStack_330 = (int)lVar8;
            iStack_32c = (int)((ulong)lVar8 >> 0x20);
            local_338 = local_338 - gap;
            iStack_334 = iStack_334 - gap;
            iStack_330 = iStack_330 - gap;
            iStack_32c = iStack_32c - gap;
            local_358 = (int)palVar5;
            iStack_354 = (int)((ulong)palVar5 >> 0x20);
            iStack_350 = (int)lVar6;
            iStack_34c = (int)((ulong)lVar6 >> 0x20);
            local_358 = local_358 - open;
            iStack_354 = iStack_354 - open;
            iStack_350 = iStack_350 - open;
            iStack_34c = iStack_34c - open;
            uVar23 = (uint)(local_338 < local_358) * local_358 |
                     (uint)(local_338 >= local_358) * local_338;
            uVar24 = (uint)(iStack_334 < iStack_354) * iStack_354 |
                     (uint)(iStack_334 >= iStack_354) * iStack_334;
            uVar28 = (uint)(iStack_330 < iStack_350) * iStack_350 |
                     (uint)(iStack_330 >= iStack_350) * iStack_330;
            uVar34 = (uint)(iStack_32c < iStack_34c) * iStack_34c |
                     (uint)(iStack_32c >= iStack_34c) * iStack_32c;
            vHt[1] = CONCAT44(uVar24,uVar23);
            vE[0] = CONCAT44(uVar34,uVar28);
            local_498 = (int)pvW;
            iStack_494 = (int)((ulong)pvW >> 0x20);
            iStack_490 = (int)vHp[0];
            iStack_48c = (int)((ulong)vHp[0] >> 0x20);
            local_4a8 = (int)uVar9;
            iStack_4a4 = (int)((ulong)uVar9 >> 0x20);
            iStack_4a0 = (int)uVar10;
            iStack_49c = (int)((ulong)uVar10 >> 0x20);
            local_498 = local_498 + local_4a8;
            iStack_494 = iStack_494 + iStack_4a4;
            iStack_490 = iStack_490 + iStack_4a0;
            iStack_48c = iStack_48c + iStack_49c;
            lVar7 = ptr_03[k][0];
            local_4c8 = (int)lVar7;
            iStack_4c4 = (int)((ulong)lVar7 >> 0x20);
            iStack_4c0 = (int)ptr_03[k][1];
            local_4b8 = local_4b8 + local_4c8;
            iStack_4b4 = iStack_4b4 + iStack_4c4;
            iStack_4b0 = iStack_4b0 + iStack_4c0;
            vH[1] = CONCAT44((uint)(iStack_114 < iStack_4b4) * iStack_4b4 |
                             (uint)(iStack_114 >= iStack_4b4) * iStack_114,
                             (uint)(local_118 < local_4b8) * local_4b8 |
                             (uint)(local_118 >= local_4b8) * local_118);
            vF[0] = (longlong)
                    ((uint)(iStack_110 < iStack_4b0) * iStack_4b0 |
                    (uint)(iStack_110 >= iStack_4b0) * iStack_110);
            vF[1] = CONCAT44((uint)((int)uVar24 < iStack_494) * iStack_494 |
                             ((int)uVar24 >= iStack_494) * uVar24,
                             (uint)((int)uVar23 < local_498) * local_498 |
                             ((int)uVar23 >= local_498) * uVar23);
            vHt[0] = CONCAT44((uint)((int)uVar34 < iStack_48c) * iStack_48c |
                              ((int)uVar34 >= iStack_48c) * uVar34,
                              (uint)((int)uVar28 < iStack_490) * iStack_490 |
                              ((int)uVar28 >= iStack_490) * uVar28);
            ptr[k][0] = vHt[1];
            ptr[k][1] = vE[0];
            ptr_01[k][0] = vF[1];
            ptr_01[k][1] = vHt[0];
            k = k + 1;
            pvW = palVar5;
            vHp[0] = lVar6;
          }
          iVar2 = ptr_00[(long)end_query + 1];
          local_4e8 = (int)(*ptr_03)[0];
          iStack_4e4 = (int)((ulong)(*ptr_03)[0] >> 0x20);
          iStack_4e0 = (int)(*ptr_03)[1];
          local_4e8 = iVar2 + local_4e8;
          iStack_4e4 = local_4b8 + iStack_4e4;
          iStack_4e0 = iStack_4b4 + iStack_4e0;
          uVar23 = (uint)(iStack_110 < iStack_4e0) * iStack_4e0 |
                   (uint)(iStack_110 >= iStack_4e0) * iStack_110;
          vH[1] = CONCAT44((uint)(iStack_114 < iStack_4e4) * iStack_4e4 |
                           (uint)(iStack_114 >= iStack_4e4) * iStack_114,
                           (uint)(local_118 < local_4e8) * local_4e8 |
                           (uint)(local_118 >= local_4e8) * local_118);
          k = 0;
          while( true ) {
            vF[0] = (longlong)uVar23;
            iStack_4f4 = (int)vH[1];
            iStack_4f0 = (int)((ulong)vH[1] >> 0x20);
            if (1 < k) break;
            iVar25 = iStack_4f4 + result._4_4_;
            iVar29 = iStack_4f0 + (int)vSegLenXgap[0];
            uVar23 = (uint)((int)uVar23 < iVar29) * iVar29 | ((int)uVar23 >= iVar29) * uVar23;
            vH[1] = CONCAT44((uint)(iStack_4f0 < iVar25) * iVar25 |
                             (uint)(iStack_4f0 >= iVar25) * iStack_4f0,
                             (iStack_4f4 < (int)(uint)result) * (uint)result |
                             (uint)(iStack_4f4 >= (int)(uint)result) * iStack_4f4);
            k = k + 1;
          }
          vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
          local_528 = (int)vSegLenXgap[1];
          iStack_524 = (int)((ulong)vSegLenXgap[1] >> 0x20);
          iStack_4f4 = iStack_4f4 + iStack_524;
          vH[1] = CONCAT44(iStack_4f4,local_528);
          vHp[1] = CONCAT44((uint)(local_4b8 < iStack_4f4) * iStack_4f4 |
                            (uint)(local_4b8 >= iStack_4f4) * local_4b8,
                            (uint)(iVar2 < local_528) * local_528 |
                            (uint)(iVar2 >= local_528) * iVar2);
          vH[0] = CONCAT44((iStack_4b0 < (int)uVar23) * uVar23 |
                           (uint)(iStack_4b0 >= (int)uVar23) * iStack_4b0,
                           (uint)(iStack_4b4 < iStack_4f0) * iStack_4f0 |
                           (uint)(iStack_4b4 >= iStack_4f0) * iStack_4b4);
          for (k = 0; k < iVar15; k = k + 1) {
            lVar6 = ptr_01[k][0];
            lVar7 = ptr_01[k][1];
            local_378 = (int)vH[1];
            iStack_374 = (int)((ulong)vH[1] >> 0x20);
            iStack_370 = (int)vF[0];
            iStack_36c = (int)((ulong)vF[0] >> 0x20);
            local_378 = local_378 - gap;
            iStack_374 = iStack_374 - gap;
            iStack_370 = iStack_370 - gap;
            iStack_36c = iStack_36c - gap;
            local_398 = (int)vHp[1];
            iStack_394 = (int)((ulong)vHp[1] >> 0x20);
            iStack_390 = (int)vH[0];
            iStack_38c = (int)((ulong)vH[0] >> 0x20);
            local_398 = local_398 - open;
            iStack_394 = iStack_394 - open;
            iStack_390 = iStack_390 - open;
            iStack_38c = iStack_38c - open;
            uVar23 = (uint)(local_378 < local_398) * local_398 |
                     (uint)(local_378 >= local_398) * local_378;
            uVar34 = (uint)(iStack_374 < iStack_394) * iStack_394 |
                     (uint)(iStack_374 >= iStack_394) * iStack_374;
            uVar30 = (uint)(iStack_370 < iStack_390) * iStack_390 |
                     (uint)(iStack_370 >= iStack_390) * iStack_370;
            uVar35 = (uint)(iStack_36c < iStack_38c) * iStack_38c |
                     (uint)(iStack_36c >= iStack_38c) * iStack_36c;
            vH[1] = CONCAT44(uVar34,uVar23);
            vF[0] = CONCAT44(uVar35,uVar30);
            local_1d8 = (int)lVar6;
            iStack_1d4 = (int)((ulong)lVar6 >> 0x20);
            iStack_1d0 = (int)lVar7;
            iStack_1cc = (int)((ulong)lVar7 >> 0x20);
            uVar24 = (local_1d8 < (int)uVar23) * uVar23 |
                     (uint)(local_1d8 >= (int)uVar23) * local_1d8;
            uVar26 = (iStack_1d4 < (int)uVar34) * uVar34 |
                     (uint)(iStack_1d4 >= (int)uVar34) * iStack_1d4;
            uVar31 = (iStack_1d0 < (int)uVar30) * uVar30 |
                     (uint)(iStack_1d0 >= (int)uVar30) * iStack_1d0;
            uVar36 = (iStack_1cc < (int)uVar35) * uVar35 |
                     (uint)(iStack_1cc >= (int)uVar35) * iStack_1cc;
            vHp[1] = CONCAT44(uVar26,uVar24);
            vH[0] = CONCAT44(uVar36,uVar31);
            ptr_02[k][0] = vHp[1];
            ptr_02[k][1] = vH[0];
            local_298 = (int)vSaturationCheckMax[1];
            iStack_294 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_290 = (int)vSaturationCheckMin[0];
            iStack_28c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            uVar28 = ((int)uVar24 < local_298) * uVar24 |
                     (uint)((int)uVar24 >= local_298) * local_298;
            uVar27 = ((int)uVar26 < iStack_294) * uVar26 |
                     (uint)((int)uVar26 >= iStack_294) * iStack_294;
            uVar32 = ((int)uVar31 < iStack_290) * uVar31 |
                     (uint)((int)uVar31 >= iStack_290) * iStack_290;
            uVar37 = ((int)uVar36 < iStack_28c) * uVar36 |
                     (uint)((int)uVar36 >= iStack_28c) * iStack_28c;
            vSaturationCheckMax[1] =
                 CONCAT44(((int)uVar34 < (int)uVar27) * uVar34 |
                          ((int)uVar34 >= (int)uVar27) * uVar27,
                          ((int)uVar23 < (int)uVar28) * uVar23 |
                          ((int)uVar23 >= (int)uVar28) * uVar28);
            vSaturationCheckMin[0] =
                 CONCAT44(((int)uVar35 < (int)uVar37) * uVar35 |
                          ((int)uVar35 >= (int)uVar37) * uVar37,
                          ((int)uVar30 < (int)uVar32) * uVar30 |
                          ((int)uVar30 >= (int)uVar32) * uVar32);
            local_1f8 = (int)vMaxH[1];
            iStack_1f4 = (int)((ulong)vMaxH[1] >> 0x20);
            iStack_1f0 = (int)vSaturationCheckMax[0];
            iStack_1ec = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            vMaxH[1] = CONCAT44((iStack_1f4 < (int)uVar26) * uVar26 |
                                (uint)(iStack_1f4 >= (int)uVar26) * iStack_1f4,
                                (local_1f8 < (int)uVar24) * uVar24 |
                                (uint)(local_1f8 >= (int)uVar24) * local_1f8);
            vSaturationCheckMax[0] =
                 CONCAT44((iStack_1ec < (int)uVar36) * uVar36 |
                          (uint)(iStack_1ec >= (int)uVar36) * iStack_1ec,
                          (iStack_1f0 < (int)uVar31) * uVar31 |
                          (uint)(iStack_1f0 >= (int)uVar31) * iStack_1f0);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar15;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,vH_00,end_query,s2Len,iVar20,
                            in_stack_fffffffffffff728);
          }
          lVar6 = ptr_02[iVar22][0];
          lVar7 = ptr_02[iVar22][1];
          local_98 = (int)lVar6;
          iStack_94 = (int)((ulong)lVar6 >> 0x20);
          iStack_90 = (int)lVar7;
          iStack_8c = (int)((ulong)lVar7 >> 0x20);
          local_a8 = (int)vPosMask[1];
          iStack_a4 = (int)((ulong)vPosMask[1] >> 0x20);
          iStack_a0 = (int)vMaxH[0];
          iStack_9c = (int)((ulong)vMaxH[0] >> 0x20);
          uVar33 = CONCAT44(-(uint)(uVar16 == 0xfffffffc),-(uint)(iVar17 == 1)) &
                   CONCAT44(-(uint)(iStack_9c < iStack_8c),-(uint)(iStack_a0 < iStack_90));
          vPosMask[1] = CONCAT44((uint)(iStack_94 < iStack_a4) * iStack_a4 |
                                 (uint)(iStack_94 >= iStack_a4) * iStack_94,
                                 (uint)(local_98 < local_a8) * local_a8 |
                                 (uint)(local_98 >= local_a8) * local_98);
          vMaxH[0] = CONCAT44((uint)(iStack_8c < iStack_9c) * iStack_9c |
                              (uint)(iStack_8c >= iStack_9c) * iStack_8c,
                              (uint)(iStack_90 < iStack_a0) * iStack_a0 |
                              (uint)(iStack_90 >= iStack_a0) * iStack_90);
          auVar14._8_8_ = uVar33;
          auVar14._0_8_ =
               CONCAT44(-(uint)(iVar17 == 2),-(uint)(iVar17 == 3)) &
               CONCAT44(-(uint)(iStack_a4 < iStack_94),-(uint)(local_a8 < local_98));
          if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar33 >> 7 & 1) != 0) || (uVar33 >> 0xf & 1) != 0) ||
                  (uVar33 >> 0x17 & 1) != 0) || (uVar33 >> 0x1f & 1) != 0) ||
                (uVar33 >> 0x27 & 1) != 0) || (uVar33 >> 0x2f & 1) != 0) ||
              (uVar33 >> 0x37 & 1) != 0) || (long)uVar33 < 0) {
            matrix._4_4_ = end_query;
          }
        }
        local_71c = uVar18;
        if (s2_end != 0) {
          for (end_ref = 0; end_ref < iVar17; end_ref = end_ref + 1) {
            vMaxH[0] = vMaxH[0] << 0x20 | (ulong)vPosMask[1] >> 0x20;
            vPosMask[1] = vPosMask[1] << 0x20;
          }
          local_71c = vMaxH[0]._4_4_;
        }
        s1Len = iVar1 + -1;
        if (s1_end != 0) {
          _temp = ptr_02;
          for (k = 0; k < iVar15 * 4; k = k + 1) {
            iVar20 = k / 4 + (k % 4) * iVar15;
            if (iVar20 < iVar1) {
              if ((int)local_71c < (int)(*_temp)[0]) {
                local_71c = (uint)(*_temp)[0];
                matrix._4_4_ = s2Len + -1;
                s1Len = iVar20;
              }
              else if ((((uint)(*_temp)[0] == local_71c) && (matrix._4_4_ == s2Len + -1)) &&
                      (iVar20 < s1Len)) {
                s1Len = iVar20;
              }
            }
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = ptr_02[iVar22][1];
          uStack_8a8 = ptr_02[iVar22][0];
          for (end_ref = 0; end_ref < iVar17; end_ref = end_ref + 1) {
            vH_1[0] = vH_1[0] << 0x20 | uStack_8a8 >> 0x20;
            uStack_8a8 = uStack_8a8 << 0x20;
          }
          local_71c = vH_1[0]._4_4_;
          matrix._4_4_ = s2Len + -1;
          s1Len = iVar1 + -1;
        }
        local_28 = (int)vSaturationCheckMax[1];
        iStack_24 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_20 = (int)vSaturationCheckMin[0];
        iStack_1c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_b8 = (int)vMaxH[1];
        iStack_b4 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_b0 = (int)vSaturationCheckMax[0];
        iStack_ac = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar33 = CONCAT44(-(uint)(iStack_1c < (int)uVar18),-(uint)(iStack_20 < (int)uVar18)) |
                 CONCAT44(-(uint)(iVar19 < iStack_ac),-(uint)(iVar19 < iStack_b0));
        auVar13._8_8_ = uVar33;
        auVar13._0_8_ =
             CONCAT44(-(uint)(iStack_24 < (int)uVar18),-(uint)(local_28 < (int)uVar18)) |
             CONCAT44(-(uint)(iVar19 < iStack_b4),-(uint)(iVar19 < local_b8));
        if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar13 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar13 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar13 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar13 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar13 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar13 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar33 >> 7 & 1) != 0) || (uVar33 >> 0xf & 1) != 0) || (uVar33 >> 0x17 & 1) != 0)
               || (uVar33 >> 0x1f & 1) != 0) || (uVar33 >> 0x27 & 1) != 0) ||
             (uVar33 >> 0x2f & 1) != 0) || (uVar33 >> 0x37 & 1) != 0) || (long)uVar33 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_71c = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(uint *)&_segNum->s1 = local_71c;
        *(int32_t *)((long)&_segNum->s1 + 4) = s1Len;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}